

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  TableCache *this_00;
  uint64_t file_number;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  Iterator **children;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_01;
  Iterator *pIVar6;
  const_reference ppFVar7;
  LevelFileNumIterator *this_02;
  int local_68;
  Iterator *result;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int which;
  int num;
  Iterator **list;
  undefined1 local_28 [4];
  int space;
  ReadOptions options;
  Compaction *c_local;
  VersionSet *this_local;
  
  options.snapshot = (Snapshot *)c;
  ReadOptions::ReadOptions((ReadOptions *)local_28);
  local_28[0] = (bool)(this->options_->paranoid_checks & 1);
  local_28[1] = false;
  iVar3 = Compaction::level((Compaction *)options.snapshot);
  if (iVar3 == 0) {
    sVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       (options.snapshot + 0x18));
    local_68 = (int)sVar4 + 1;
  }
  else {
    local_68 = 2;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_68;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  children = (Iterator **)operator_new__(uVar5);
  files._4_4_ = 0;
  for (files._0_4_ = 0; (int)files < 2; files._0_4_ = (int)files + 1) {
    bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       (options.snapshot + (long)(int)files * 3 + 0x18));
    if (!bVar2) {
      iVar3 = Compaction::level((Compaction *)options.snapshot);
      if (iVar3 + (int)files == 0) {
        this_01 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                  (options.snapshot + (long)(int)files * 3 + 0x18);
        for (result = (Iterator *)0x0;
            pIVar6 = (Iterator *)
                     std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ::size(this_01), result < pIVar6;
            result = (Iterator *)((long)&result->_vptr_Iterator + 1)) {
          this_00 = this->table_cache_;
          ppFVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    operator[](this_01,(size_type)result);
          file_number = (*ppFVar7)->number;
          ppFVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                    operator[](this_01,(size_type)result);
          pIVar6 = TableCache::NewIterator
                             (this_00,(ReadOptions *)local_28,file_number,(*ppFVar7)->file_size,
                              (Table **)0x0);
          children[files._4_4_] = pIVar6;
          files._4_4_ = files._4_4_ + 1;
        }
      }
      else {
        this_02 = (LevelFileNumIterator *)operator_new(0x58);
        Version::LevelFileNumIterator::LevelFileNumIterator
                  (this_02,&this->icmp_,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   (options.snapshot + (long)(int)files * 3 + 0x18));
        pIVar6 = NewTwoLevelIterator((Iterator *)this_02,GetFileIterator,this->table_cache_,
                                     (ReadOptions *)local_28);
        children[files._4_4_] = pIVar6;
        files._4_4_ = files._4_4_ + 1;
      }
    }
  }
  if (local_68 < files._4_4_) {
    __assert_fail("num <= space",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
  }
  pIVar6 = NewMergingIterator(&(this->icmp_).super_Comparator,children,files._4_4_);
  if (children != (Iterator **)0x0) {
    operator_delete__(children);
  }
  return pIVar6;
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}